

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.cxx
# Opt level: O2

bool __thiscall nuraft::peer::recreate_rpc(peer *this,ptr<srv_config> *config,context *ctx)

{
  timer_helper *this_00;
  element_type *peVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  debugging_options *pdVar5;
  size_t sVar6;
  string sStack_68;
  ptr<rpc_client_factory> factory;
  
  if (((this->abandoned_)._M_base._M_i & 1U) != 0) {
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1 != (element_type *)0x0) && (iVar4 = (*peVar1->_vptr_logger[7])(), 5 < iVar4)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&sStack_68,"peer %d is abandoned",
                 (ulong)(uint)((config->
                               super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr)->id_);
      (*peVar1->_vptr_logger[8])
                (peVar1,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/peer.cxx"
                 ,"recreate_rpc",0xc3,&sStack_68);
      std::__cxx11::string::~string((string *)&sStack_68);
    }
    return false;
  }
  factory.super___shared_ptr<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  factory.super___shared_ptr<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::mutex::lock(&ctx->ctx_lock_);
  std::__shared_ptr<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&factory.super___shared_ptr<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2>,
             &(ctx->rpc_cli_factory_).
              super___shared_ptr<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2>);
  pthread_mutex_unlock((pthread_mutex_t *)&ctx->ctx_lock_);
  if (factory.super___shared_ptr<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1 != (element_type *)0x0) && (iVar4 = (*peVar1->_vptr_logger[7])(), 5 < iVar4)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_(&sStack_68,"client factory is empty");
      (*peVar1->_vptr_logger[8])
                (peVar1,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/peer.cxx"
                 ,"recreate_rpc",0xcc,&sStack_68);
      std::__cxx11::string::~string((string *)&sStack_68);
    }
    bVar3 = false;
    goto LAB_001a7c03;
  }
  std::mutex::lock(&this->rpc_protector_);
  pdVar5 = debugging_options::get_instance();
  if (((pdVar5->disable_reconn_backoff_)._M_base._M_i & 1U) == 0) {
    bVar3 = timer_helper::timeout(&this->reconn_backoff_);
    if (bVar3) goto LAB_001a7ab1;
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1 != (element_type *)0x0) && (iVar4 = (*peVar1->_vptr_logger[7])(), 5 < iVar4)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_(&sStack_68,"skip reconnect this time");
      (*peVar1->_vptr_logger[8])
                (peVar1,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/peer.cxx"
                 ,"recreate_rpc",0xef,&sStack_68);
      std::__cxx11::string::~string((string *)&sStack_68);
    }
    bVar3 = false;
  }
  else {
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1 != (element_type *)0x0) && (iVar4 = (*peVar1->_vptr_logger[7])(), 5 < iVar4)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_(&sStack_68,"reconnection back-off timer is disabled");
      (*peVar1->_vptr_logger[8])
                (peVar1,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/peer.cxx"
                 ,"recreate_rpc",0xd6,&sStack_68);
      std::__cxx11::string::~string((string *)&sStack_68);
    }
LAB_001a7ab1:
    this_00 = &this->reconn_backoff_;
    timer_helper::reset(this_00);
    sVar6 = timer_helper::get_duration_us(this_00);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = sVar6;
    iVar4 = SUB164(auVar2 / ZEXT816(1000),0) * 2;
    if (this->hb_interval_ <= iVar4) {
      iVar4 = this->hb_interval_;
    }
    timer_helper::set_duration_ms(this_00,(long)(int)(iVar4 + (uint)(iVar4 == 0)));
    (*(factory.super___shared_ptr<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_rpc_client_factory[2])
              (&sStack_68,
               factory.super___shared_ptr<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,&((config->super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr)->endpoint_);
    std::__shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->rpc_).super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2> *)&sStack_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sStack_68._M_string_length);
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1 != (element_type *)0x0) && (iVar4 = (*peVar1->_vptr_logger[7])(), 5 < iVar4)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&sStack_68,"%p reconnect peer %d",
                 (this->rpc_).super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,(ulong)(uint)((this->config_).
                                      super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->id_);
      (*peVar1->_vptr_logger[8])
                (peVar1,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/peer.cxx"
                 ,"recreate_rpc",0xe3,&sStack_68);
      std::__cxx11::string::~string((string *)&sStack_68);
    }
    timer_helper::reset(&this->last_active_timer_);
    LOCK();
    (this->busy_flag_)._M_base._M_i = false;
    UNLOCK();
    bVar3 = true;
    LOCK();
    (this->manual_free_)._M_base._M_i = true;
    UNLOCK();
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->rpc_protector_);
LAB_001a7c03:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&factory.super___shared_ptr<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return bVar3;
}

Assistant:

bool peer::recreate_rpc(ptr<srv_config>& config,
                        context& ctx)
{
    if (abandoned_) {
        p_tr("peer %d is abandoned", config->get_id());
        return false;
    }

    ptr<rpc_client_factory> factory = nullptr;
    {   std::lock_guard<std::mutex> l(ctx.ctx_lock_);
        factory = ctx.rpc_cli_factory_;
    }
    if (!factory) {
        p_tr("client factory is empty");
        return false;
    }

    std::lock_guard<std::mutex> l(rpc_protector_);

    bool backoff_timer_disabled =
        debugging_options::get_instance()
        .disable_reconn_backoff_.load(std::memory_order_relaxed);
    if (backoff_timer_disabled) {
        p_tr("reconnection back-off timer is disabled");
    }

    // To avoid too frequent reconnection attempt,
    // we use exponential backoff (x2) from 1 ms to heartbeat interval.
    if (backoff_timer_disabled || reconn_backoff_.timeout()) {
        reconn_backoff_.reset();
        size_t new_duration_ms = reconn_backoff_.get_duration_us() / 1000;
        new_duration_ms = std::min( hb_interval_, (int32)new_duration_ms * 2 );
        if (!new_duration_ms) new_duration_ms = 1;
        reconn_backoff_.set_duration_ms(new_duration_ms);

        rpc_ = factory->create_client(config->get_endpoint());
        p_tr("%p reconnect peer %d", rpc_.get(), config_->get_id());

        // WARNING:
        //   A reconnection attempt should be treated as an activity,
        //   hence reset timer.
        reset_active_timer();

        set_free();
        set_manual_free();
        return true;

    } else {
        p_tr("skip reconnect this time");
    }
    return false;
}